

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::CastExpressionSyntax::setChild
          (CastExpressionSyntax *this,size_t index,TokenOrSyntax child)

{
  ParenthesizedExpressionSyntax *pPVar1;
  SyntaxNode *pSVar2;
  Token TVar3;
  
  if (index == 2) {
    pSVar2 = TokenOrSyntax::node(&child);
    if (pSVar2 == (SyntaxNode *)0x0) {
      pPVar1 = (ParenthesizedExpressionSyntax *)0x0;
    }
    else {
      pPVar1 = (ParenthesizedExpressionSyntax *)TokenOrSyntax::node(&child);
    }
    (this->right).ptr = pPVar1;
  }
  else if (index == 1) {
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->apostrophe).kind = TVar3.kind;
    (this->apostrophe).field_0x2 = TVar3._2_1_;
    (this->apostrophe).numFlags = (NumericTokenFlags)TVar3.numFlags.raw;
    (this->apostrophe).rawLen = TVar3.rawLen;
    (this->apostrophe).info = TVar3.info;
  }
  else {
    pSVar2 = TokenOrSyntax::node(&child);
    if (pSVar2 == (SyntaxNode *)0x0) {
      pSVar2 = (SyntaxNode *)0x0;
    }
    else {
      pSVar2 = TokenOrSyntax::node(&child);
    }
    (this->left).ptr = (ExpressionSyntax *)pSVar2;
  }
  return;
}

Assistant:

void CastExpressionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: left = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 1: apostrophe = child.token(); return;
        case 2: right = child.node() ? &child.node()->as<ParenthesizedExpressionSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}